

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O0

char * addbrackets(char *string)

{
  size_t sVar1;
  char *pcVar2;
  char *cp;
  char *buffer;
  size_t length;
  char *string_local;
  
  if (string == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(string);
    if ((*string == '[') && (string[sVar1 - 1] == ']')) {
      string_local = strdup(string);
    }
    else {
      string_local = (char *)malloc(sVar1 + 3);
      if (string_local == (char *)0x0) {
        string_local = (char *)0x0;
      }
      else {
        *string_local = '[';
        pcVar2 = stpcpy(string_local + 1,string);
        *pcVar2 = ']';
        pcVar2[1] = '\0';
      }
    }
  }
  return string_local;
}

Assistant:

char *addbrackets(const char *string) {
  if (string == NULL)
    return NULL;
  size_t length = strlen(string);
  if (!(*string == '[' && string[length - 1] == ']')) {
    char *buffer = malloc(length + 3);
    if (buffer == NULL)
      return NULL;
    char *cp = buffer;
    *cp++ = '[';
    cp = stpcpy (cp, string);
    *cp++ = ']';
    *cp = '\0';
    return buffer;
  }
  return strdup(string);
}